

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O3

string * __thiscall
cmFindProgramCommand::FindNormalProgramDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  long *plVar1;
  bool bVar2;
  pointer pbVar3;
  string *psVar4;
  pointer name;
  pointer pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer __x;
  cmFindProgramHelper helper;
  string local_c8;
  cmFindProgramCommand *local_a8;
  cmFindProgramHelper local_a0;
  
  cmFindProgramHelper::cmFindProgramHelper(&local_a0);
  __x = (this->super_cmFindBase).Names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (__x != (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = this;
    do {
      pbVar3 = local_a0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar5 = local_a0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_a0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_a0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar6 = &(local_a0.Names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar1 = (long *)(((string *)(paVar6 + -1))->_M_dataplus)._M_p;
          if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar1) {
            operator_delete(plVar1,paVar6->_M_allocated_capacity + 1);
          }
          psVar4 = (string *)(paVar6 + 1);
          paVar6 = paVar6 + 2;
        } while (psVar4 != pbVar3);
        local_a0.Names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        this = local_a8;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_a0.Names,__x);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      pbVar5 = local_a0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_a0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar2 = cmFindProgramHelper::CheckDirectoryForName(&local_a0,&local_c8,pbVar5);
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != local_a0.Names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish && !bVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        if (bVar2) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_a0.BestPath._M_dataplus._M_p,
                     local_a0.BestPath._M_dataplus._M_p + local_a0.BestPath._M_string_length);
          goto LAB_003e7f1e;
        }
      }
      pbVar5 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar4 = local_a0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar5 != pbVar3) {
        do {
          name = local_a0.Names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          if (local_a0.Names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != psVar4) {
            do {
              bVar2 = cmFindProgramHelper::CheckDirectoryForName(&local_a0,pbVar5,name);
              if (bVar2) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)__return_storage_ptr__,local_a0.BestPath._M_dataplus._M_p,
                           local_a0.BestPath._M_dataplus._M_p + local_a0.BestPath._M_string_length);
                goto LAB_003e7f1e;
              }
              psVar4 = name + 1;
              name = psVar4;
            } while (psVar4 != local_a0.Names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar3);
      }
      __x = __x + 1;
    } while (__x != (this->super_cmFindBase).Names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_003e7f1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.TestPath._M_dataplus._M_p != &local_a0.TestPath.field_2) {
    operator_delete(local_a0.TestPath._M_dataplus._M_p,
                    local_a0.TestPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0.Names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.BestPath._M_dataplus._M_p != &local_a0.BestPath.field_2) {
    operator_delete(local_a0.BestPath._M_dataplus._M_p,
                    local_a0.BestPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0.Extensions);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramDirsPerName()
{
  // Search the entire path for each name.
  cmFindProgramHelper helper;
  for (std::vector<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    // Switch to searching for this name.
    helper.SetName(*ni);

    // Check for the name by itself (e.g. an absolute path).
    if (helper.CheckDirectory(std::string())) {
      return helper.BestPath;
    }

    // Search every directory.
    for (std::vector<std::string>::const_iterator p =
           this->SearchPaths.begin();
         p != this->SearchPaths.end(); ++p) {
      if (helper.CheckDirectory(*p)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the program.
  return "";
}